

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

iterator __thiscall Character::DelItem(Character *this,iterator it,int amount)

{
  int iVar1;
  _Self *p_Var2;
  pointer pCVar3;
  const_iterator local_38;
  _List_node_base *local_30;
  int local_24;
  Character *pCStack_20;
  int amount_local;
  Character *this_local;
  iterator it_local;
  
  local_24 = amount;
  pCStack_20 = this;
  this_local = (Character *)it._M_node;
  if (0 < amount) {
    pCVar3 = std::_List_iterator<Character_Item>::operator->
                       ((_List_iterator<Character_Item> *)&this_local);
    if ((pCVar3->amount < 0) ||
       (pCVar3 = std::_List_iterator<Character_Item>::operator->
                           ((_List_iterator<Character_Item> *)&this_local), iVar1 = local_24,
       pCVar3->amount - local_24 < 1)) {
      std::_List_const_iterator<Character_Item>::_List_const_iterator
                (&local_38,(iterator *)&this_local);
      local_30 = (_List_node_base *)
                 std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase
                           (&this->inventory,local_38);
      this_local = (Character *)local_30;
    }
    else {
      pCVar3 = std::_List_iterator<Character_Item>::operator->
                         ((_List_iterator<Character_Item> *)&this_local);
      pCVar3->amount = pCVar3->amount - iVar1;
      std::_List_iterator<Character_Item>::operator++((_List_iterator<Character_Item> *)&this_local)
      ;
    }
    CalculateStats(this,true);
    return (iterator)(iterator)this_local;
  }
  p_Var2 = std::_List_iterator<Character_Item>::operator++
                     ((_List_iterator<Character_Item> *)&this_local);
  return (iterator)p_Var2->_M_node;
}

Assistant:

std::list<Character_Item>::iterator Character::DelItem(std::list<Character_Item>::iterator it, int amount)
{
	if (amount <= 0)
	{
		return ++it;
	}

	if (it->amount < 0 || it->amount - amount <= 0)
	{
		it = this->inventory.erase(it);
	}
	else
	{
		it->amount -= amount;
		++it;
	}

	this->CalculateStats();

	return it;
}